

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_ATI_vertex_array_object(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_ATI_vertex_array_object != 0) {
    glad_glNewObjectBufferATI = (PFNGLNEWOBJECTBUFFERATIPROC)(*load)("glNewObjectBufferATI");
    glad_glIsObjectBufferATI = (PFNGLISOBJECTBUFFERATIPROC)(*load)("glIsObjectBufferATI");
    glad_glUpdateObjectBufferATI =
         (PFNGLUPDATEOBJECTBUFFERATIPROC)(*load)("glUpdateObjectBufferATI");
    glad_glGetObjectBufferfvATI = (PFNGLGETOBJECTBUFFERFVATIPROC)(*load)("glGetObjectBufferfvATI");
    glad_glGetObjectBufferivATI = (PFNGLGETOBJECTBUFFERIVATIPROC)(*load)("glGetObjectBufferivATI");
    glad_glFreeObjectBufferATI = (PFNGLFREEOBJECTBUFFERATIPROC)(*load)("glFreeObjectBufferATI");
    glad_glArrayObjectATI = (PFNGLARRAYOBJECTATIPROC)(*load)("glArrayObjectATI");
    glad_glGetArrayObjectfvATI = (PFNGLGETARRAYOBJECTFVATIPROC)(*load)("glGetArrayObjectfvATI");
    glad_glGetArrayObjectivATI = (PFNGLGETARRAYOBJECTIVATIPROC)(*load)("glGetArrayObjectivATI");
    glad_glVariantArrayObjectATI =
         (PFNGLVARIANTARRAYOBJECTATIPROC)(*load)("glVariantArrayObjectATI");
    glad_glGetVariantArrayObjectfvATI =
         (PFNGLGETVARIANTARRAYOBJECTFVATIPROC)(*load)("glGetVariantArrayObjectfvATI");
    glad_glGetVariantArrayObjectivATI =
         (PFNGLGETVARIANTARRAYOBJECTIVATIPROC)(*load)("glGetVariantArrayObjectivATI");
  }
  return;
}

Assistant:

static void load_GL_ATI_vertex_array_object(GLADloadproc load) {
	if(!GLAD_GL_ATI_vertex_array_object) return;
	glad_glNewObjectBufferATI = (PFNGLNEWOBJECTBUFFERATIPROC)load("glNewObjectBufferATI");
	glad_glIsObjectBufferATI = (PFNGLISOBJECTBUFFERATIPROC)load("glIsObjectBufferATI");
	glad_glUpdateObjectBufferATI = (PFNGLUPDATEOBJECTBUFFERATIPROC)load("glUpdateObjectBufferATI");
	glad_glGetObjectBufferfvATI = (PFNGLGETOBJECTBUFFERFVATIPROC)load("glGetObjectBufferfvATI");
	glad_glGetObjectBufferivATI = (PFNGLGETOBJECTBUFFERIVATIPROC)load("glGetObjectBufferivATI");
	glad_glFreeObjectBufferATI = (PFNGLFREEOBJECTBUFFERATIPROC)load("glFreeObjectBufferATI");
	glad_glArrayObjectATI = (PFNGLARRAYOBJECTATIPROC)load("glArrayObjectATI");
	glad_glGetArrayObjectfvATI = (PFNGLGETARRAYOBJECTFVATIPROC)load("glGetArrayObjectfvATI");
	glad_glGetArrayObjectivATI = (PFNGLGETARRAYOBJECTIVATIPROC)load("glGetArrayObjectivATI");
	glad_glVariantArrayObjectATI = (PFNGLVARIANTARRAYOBJECTATIPROC)load("glVariantArrayObjectATI");
	glad_glGetVariantArrayObjectfvATI = (PFNGLGETVARIANTARRAYOBJECTFVATIPROC)load("glGetVariantArrayObjectfvATI");
	glad_glGetVariantArrayObjectivATI = (PFNGLGETVARIANTARRAYOBJECTIVATIPROC)load("glGetVariantArrayObjectivATI");
}